

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void cmsysProcess_Kill(cmsysProcess *cp)

{
  __pid_t _Var1;
  int *piVar2;
  bool bVar3;
  int local_18;
  int local_14;
  int status;
  int i;
  cmsysProcess *cp_local;
  
  if ((cp != (cmsysProcess *)0x0) && (cp->State == 3)) {
    _status = cp;
    kwsysProcessCleanupDescriptor(&cp->SignalPipe);
    kwsysProcessClosePipes(_status);
    _status->Killed = 1;
    for (local_14 = 0; local_14 < _status->NumberOfCommands; local_14 = local_14 + 1) {
      if (_status->ForkPIDs[local_14] != 0) {
        kwsysProcessKill(_status->ForkPIDs[local_14]);
        do {
          _Var1 = waitpid(_status->ForkPIDs[local_14],&local_18,0);
          bVar3 = false;
          if (_Var1 < 0) {
            piVar2 = __errno_location();
            bVar3 = *piVar2 == 4;
          }
        } while (bVar3);
      }
    }
    _status->CommandsLeft = 0;
  }
  return;
}

Assistant:

void kwsysProcess_Kill(kwsysProcess* cp)
{
  int i;

  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing)
    {
    return;
    }

  /* First close the child exit report pipe write end to avoid causing a
     SIGPIPE when the child terminates and our signal handler tries to
     report it after we have already closed the read end.  */
  kwsysProcessCleanupDescriptor(&cp->SignalPipe);

#if !defined(__APPLE__)
  /* Close all the pipe read ends.  Do this before killing the
     children because Cygwin has problems killing processes that are
     blocking to wait for writing to their output pipes.  */
  kwsysProcessClosePipes(cp);
#endif

  /* Kill the children.  */
  cp->Killed = 1;
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    int status;
    if(cp->ForkPIDs[i])
      {
      /* Kill the child.  */
      kwsysProcessKill(cp->ForkPIDs[i]);

      /* Reap the child.  Keep trying until the call is not
         interrupted.  */
      while((waitpid(cp->ForkPIDs[i], &status, 0) < 0) && (errno == EINTR));
      }
    }

#if defined(__APPLE__)
  /* Close all the pipe read ends.  Do this after killing the
     children because OS X has problems closing pipe read ends whose
     pipes are full and still have an open write end.  */
  kwsysProcessClosePipes(cp);
#endif

  cp->CommandsLeft = 0;
}